

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O0

void __thiscall QWizardPrivate::updateCurrentPage(QWizardPrivate *this)

{
  bool bVar1;
  int iVar2;
  QWizard *this_00;
  QWizardPage *pQVar3;
  QWizardPrivate *in_RDI;
  QWizard *q;
  QWizardPrivate *in_stack_00000018;
  QWizardPrivate *in_stack_000000e8;
  QWizardPrivate *this_01;
  
  this_01 = in_RDI;
  this_00 = q_func(in_RDI);
  pQVar3 = QWizard::currentPage(this_00);
  if (pQVar3 == (QWizardPage *)0x0) {
    in_RDI->canContinue = false;
    in_RDI->canFinish = false;
  }
  else {
    iVar2 = (**(code **)(*(long *)&(this_00->super_QDialog).super_QWidget + 0x1d0))();
    in_RDI->canContinue = iVar2 != -1;
    QWizard::currentPage(this_00);
    bVar1 = QWizardPage::isFinalPage((QWizardPage *)this_01);
    in_RDI->canFinish = bVar1;
  }
  _q_updateButtonStates(in_stack_000000e8);
  updateButtonTexts(in_stack_00000018);
  return;
}

Assistant:

void QWizardPrivate::updateCurrentPage()
{
    Q_Q(QWizard);
    if (q->currentPage()) {
        canContinue = (q->nextId() != -1);
        canFinish = q->currentPage()->isFinalPage();
    } else {
        canContinue = false;
        canFinish = false;
    }
    _q_updateButtonStates();
    updateButtonTexts();
}